

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O2

void __thiscall OpenMD::FragmentStamp::checkBends(FragmentStamp *this)

{
  int iVar1;
  _Head_base<2UL,_int,_false> _Var2;
  long lVar3;
  pointer piVar4;
  bool bVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  long lVar8;
  pointer piVar9;
  pointer ppBVar10;
  iterator iVar11;
  ostream *poVar12;
  OpenMDException *pOVar13;
  int __tmp;
  pointer ppBVar14;
  vector<int,_std::allocator<int>_> *cont;
  vector<int,_std::allocator<int>_> *cont_00;
  vector<int,_std::allocator<int>_> *cont_01;
  vector<int,_std::allocator<int>_> *cont_02;
  long lVar15;
  ulong uVar16;
  set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
  allBends;
  size_t ghostIndex;
  vector<int,_std::allocator<int>_> bendAtoms;
  vector<int,_std::allocator<int>_> rigidSet;
  tuple<int,_int,_int> bendTuple;
  _Bind<std::less<int>_(std::_Placeholder<1>,_int)> local_1c0;
  _Bind<std::greater<int>_(std::_Placeholder<1>,_unsigned_long)> local_1b8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  lVar15 = 0;
  uVar16 = 0;
  do {
    ppBVar10 = (this->bendStamps_).
               super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppBVar14 = (this->bendStamps_).
               super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppBVar14 - (long)ppBVar10 >> 3) <= uVar16) {
      uVar16 = 0;
      do {
        if ((ulong)((long)ppBVar14 - (long)ppBVar10 >> 3) <= uVar16) {
          allBends._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &allBends._M_t._M_impl.super__Rb_tree_header._M_header;
          allBends._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          allBends._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          allBends._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          lVar15 = 0;
          uVar16 = 0;
          allBends._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               allBends._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          while( true ) {
            if ((ulong)((long)ppBVar14 - (long)ppBVar10 >> 3) <= uVar16) {
              std::
              _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
              ::~_Rb_tree(&allBends._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
              return;
            }
            lVar3 = *(long *)((long)ppBVar10 + (lVar15 >> 0x1d));
            std::vector<int,_std::allocator<int>_>::vector
                      (&rigidSet,(vector<int,_std::allocator<int>_> *)(lVar3 + 0x98));
            if ((long)rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start == 8) {
              ghostIndex = CONCAT44(ghostIndex._4_4_,*(undefined4 *)(lVar3 + 0x94));
              _Var6 = std::
                      __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                (rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start,
                                 rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,&ghostIndex);
              if (_Var6._M_current !=
                  rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<int,_std::allocator<int>_>::insert
                          (&rigidSet,(const_iterator)_Var6._M_current,
                           (value_type_conflict1 *)&ghostIndex);
              }
            }
            _Var2._M_head_impl =
                 rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[2];
            bendTuple.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
            super__Head_base<1UL,_int,_false>._M_head_impl =
                 rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
            bendTuple.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
            _M_head_impl = *rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
            bendTuple.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
            super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
                 (_Head_base<2UL,_int,_false>)(_Head_base<2UL,_int,_false>)_Var2._M_head_impl;
            if (_Var2._M_head_impl <
                bendTuple.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
                _M_head_impl) {
              bendTuple.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
              super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
                   (_Head_base<2UL,_int,_false>)
                   (_Head_base<2UL,_int,_false>)
                   bendTuple.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>
                   ._M_head_impl;
              bendTuple.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
              _M_head_impl = _Var2._M_head_impl;
            }
            iVar11 = std::
                     _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                     ::find(&allBends._M_t,&bendTuple);
            if ((_Rb_tree_header *)iVar11._M_node != &allBends._M_t._M_impl.super__Rb_tree_header)
            break;
            std::
            _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
            ::_M_insert_unique<std::tuple<int,int,int>const&>
                      ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
                        *)&allBends,&bendTuple);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&rigidSet.super__Vector_base<int,_std::allocator<int>_>);
            uVar16 = uVar16 + 1;
            ppBVar10 = (this->bendStamps_).
                       super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppBVar14 = (this->bendStamps_).
                       super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            lVar15 = lVar15 + 0x100000000;
          }
          poVar12 = std::operator<<((ostream *)&oss,"Error in Fragment ");
          std::__cxx11::string::string((string *)&ghostIndex,(string *)&(this->Name).data_);
          poVar12 = std::operator<<(poVar12,(string *)&ghostIndex);
          poVar12 = std::operator<<(poVar12,": ");
          poVar12 = std::operator<<(poVar12,"Bend");
          containerToString<std::vector<int,std::allocator<int>>>
                    ((string *)&bendAtoms,(OpenMD *)&rigidSet,cont_02);
          poVar12 = std::operator<<(poVar12,(string *)&bendAtoms);
          std::operator<<(poVar12," appears multiple times\n");
          std::__cxx11::string::~string((string *)&bendAtoms);
          std::__cxx11::string::~string((string *)&ghostIndex);
          pOVar13 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar13,(string *)&ghostIndex);
          __cxa_throw(pOVar13,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   &bendAtoms.super__Vector_base<int,_std::allocator<int>_>,
                   &ppBVar10[(int)uVar16]->members_);
        allBends._M_t._M_impl._0_4_ = 0;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   &rigidSet.super__Vector_base<int,_std::allocator<int>_>,
                   (long)(this->rigidBodyStamps_).
                         super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->rigidBodyStamps_).
                         super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3,
                   (value_type_conflict1 *)&allBends,(allocator_type *)&ghostIndex);
        piVar4 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (piVar9 = bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar9 != bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish; piVar9 = piVar9 + 1) {
          lVar15 = (long)piVar4[*piVar9];
          if ((-1 < lVar15) &&
             (iVar1 = rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar15],
             rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar15] = iVar1 + 1, 1 < iVar1)) {
            poVar12 = std::operator<<((ostream *)&oss,"Error in Fragment ");
            std::__cxx11::string::string((string *)&allBends,(string *)&(this->Name).data_);
            poVar12 = std::operator<<(poVar12,(string *)&allBends);
            poVar12 = std::operator<<(poVar12,": bend");
            containerToString<std::vector<int,std::allocator<int>>>
                      ((string *)&ghostIndex,(OpenMD *)&bendAtoms,cont);
            poVar12 = std::operator<<(poVar12,(string *)&ghostIndex);
            std::operator<<(poVar12,"has three atoms on the same rigid body\n");
            std::__cxx11::string::~string((string *)&ghostIndex);
            std::__cxx11::string::~string((string *)&allBends);
            pOVar13 = (OpenMDException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            OpenMDException::OpenMDException(pOVar13,(string *)&allBends);
            __cxa_throw(pOVar13,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
          }
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&rigidSet.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&bendAtoms.super__Vector_base<int,_std::allocator<int>_>);
        uVar16 = uVar16 + 1;
        ppBVar10 = (this->bendStamps_).
                   super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppBVar14 = (this->bendStamps_).
                   super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      } while( true );
    }
    lVar3 = *(long *)((long)ppBVar10 + (lVar15 >> 0x1d));
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &bendAtoms.super__Vector_base<int,_std::allocator<int>_>,
               (vector<int,_std::allocator<int>_> *)(lVar3 + 0x98));
    local_1b8._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Tuple_impl<0UL,_std::_Placeholder<1>,_unsigned_long>)
         (((long)(this->atomStamps_).
                 super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->atomStamps_).
                 super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) - 1);
    _Var6 = std::
            find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_1b8);
    local_1c0._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_int>.
    super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
         (_Tuple_impl<0UL,_std::_Placeholder<1>,_int>)(_Tuple_impl<1UL,_int>)0x0;
    _Var7 = std::
            find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_1c0);
    if ((_Var6._M_current !=
         bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) ||
       (_Var7._M_current !=
        bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      poVar12 = std::operator<<((ostream *)&oss,"Error in Fragment ");
      std::__cxx11::string::string((string *)&allBends,(string *)&(this->Name).data_);
      poVar12 = std::operator<<(poVar12,(string *)&allBends);
      poVar12 = std::operator<<(poVar12," : atoms of bend");
      containerToString<std::vector<int,std::allocator<int>>>
                ((string *)&ghostIndex,(OpenMD *)&bendAtoms,cont_00);
      poVar12 = std::operator<<(poVar12,(string *)&ghostIndex);
      std::operator<<(poVar12," have invalid indices\n");
      std::__cxx11::string::~string((string *)&ghostIndex);
      std::__cxx11::string::~string((string *)&allBends);
      pOVar13 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      OpenMDException::OpenMDException(pOVar13,(string *)&allBends);
      __cxa_throw(pOVar13,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    bVar5 = hasDuplicateElement<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)
                       &bendAtoms.super__Vector_base<int,_std::allocator<int>_>);
    if (bVar5) {
      poVar12 = std::operator<<((ostream *)&oss,"Error in Fragment ");
      std::__cxx11::string::string((string *)&allBends,(string *)&(this->Name).data_);
      poVar12 = std::operator<<(poVar12,(string *)&allBends);
      poVar12 = std::operator<<(poVar12," : atoms of bend");
      containerToString<std::vector<int,std::allocator<int>>>
                ((string *)&ghostIndex,(OpenMD *)&bendAtoms,cont_01);
      poVar12 = std::operator<<(poVar12,(string *)&ghostIndex);
      std::operator<<(poVar12," have duplicated indices\n");
      std::__cxx11::string::~string((string *)&ghostIndex);
      std::__cxx11::string::~string((string *)&allBends);
      pOVar13 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      OpenMDException::OpenMDException(pOVar13,(string *)&allBends);
      __cxa_throw(pOVar13,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    lVar8 = (long)bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    if (lVar8 == 3) {
      if (*(char *)(lVar3 + 0x92) == '\0') {
        poVar12 = std::operator<<((ostream *)&oss,"Error in Fragment ");
        std::__cxx11::string::string((string *)&allBends,(string *)&(this->Name).data_);
        poVar12 = std::operator<<(poVar12,(string *)&allBends);
        std::operator<<(poVar12,": normal bend should not have ghostVectorSouce\n");
        std::__cxx11::string::~string((string *)&allBends);
        pOVar13 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar13,(string *)&allBends);
        __cxa_throw(pOVar13,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
    }
    else if (lVar8 == 2) {
      if (*(char *)(lVar3 + 0x92) == '\x01') {
        poVar12 = std::operator<<((ostream *)&oss,"Error in Fragment ");
        std::__cxx11::string::string((string *)&allBends,(string *)&(this->Name).data_);
        poVar12 = std::operator<<(poVar12,(string *)&allBends);
        std::operator<<(poVar12,": ghostVectorSouce is missing\n");
        std::__cxx11::string::~string((string *)&allBends);
        pOVar13 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar13,(string *)&allBends);
        __cxa_throw(pOVar13,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      ghostIndex = (size_t)*(int *)(lVar3 + 0x94);
      if ((ulong)((long)(this->atomStamps_).
                        super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->atomStamps_).
                        super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= ghostIndex) {
        poVar12 = std::operator<<((ostream *)&oss,"Error in Fragment ");
        std::__cxx11::string::string((string *)&allBends,(string *)&(this->Name).data_);
        poVar12 = std::operator<<(poVar12,(string *)&allBends);
        poVar12 = std::operator<<(poVar12,": ghostVectorSource ");
        poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
        std::operator<<(poVar12,"  is invalid\n");
        std::__cxx11::string::~string((string *)&allBends);
        pOVar13 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar13,(string *)&allBends);
        __cxa_throw(pOVar13,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                        (bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&ghostIndex);
      if (_Var6._M_current ==
          bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        poVar12 = std::operator<<((ostream *)&oss,"Error in Fragment ");
        std::__cxx11::string::string((string *)&allBends,(string *)&(this->Name).data_);
        poVar12 = std::operator<<(poVar12,(string *)&allBends);
        poVar12 = std::operator<<(poVar12,": ghostVectorSouce ");
        poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
        std::operator<<(poVar12,"is invalid\n");
        std::__cxx11::string::~string((string *)&allBends);
        pOVar13 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar13,(string *)&allBends);
        __cxa_throw(pOVar13,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      if ((this->atomStamps_).
          super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
          super__Vector_impl_data._M_start[(int)ghostIndex]->haveOrt_ == false) {
        poVar12 = std::operator<<((ostream *)&oss,"Error in Fragment ");
        std::__cxx11::string::string((string *)&allBends,(string *)&(this->Name).data_);
        poVar12 = std::operator<<(poVar12,(string *)&allBends);
        std::operator<<(poVar12,": ghost atom must be a directional atom\n");
        std::__cxx11::string::~string((string *)&allBends);
        pOVar13 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar13,(string *)&allBends);
        __cxa_throw(pOVar13,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&bendAtoms.super__Vector_base<int,_std::allocator<int>_>);
    uVar16 = uVar16 + 1;
    lVar15 = lVar15 + 0x100000000;
  } while( true );
}

Assistant:

void FragmentStamp::checkBends() {
    std::ostringstream oss;
    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp         = getBendStamp(i);
      std::vector<int> bendAtoms   = bendStamp->getMembers();
      std::vector<int>::iterator j = std::find_if(
          bendAtoms.begin(), bendAtoms.end(),
          std::bind(std::greater<int>(), placeholders::_1, getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(bendAtoms.begin(), bendAtoms.end(),
                       std::bind(std::less<int>(), placeholders::_1, 0));

      if (j != bendAtoms.end() || k != bendAtoms.end()) {
        oss << "Error in Fragment " << getName() << " : atoms of bend"
            << containerToString(bendAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }

      if (hasDuplicateElement(bendAtoms)) {
        oss << "Error in Fragment " << getName() << " : atoms of bend"
            << containerToString(bendAtoms) << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }

      if (bendAtoms.size() == 2) {
        if (!bendStamp->haveGhostVectorSource()) {
          oss << "Error in Fragment " << getName()
              << ": ghostVectorSouce is missing\n";
          throw OpenMDException(oss.str());
        } else {
          std::size_t ghostIndex = bendStamp->getGhostVectorSource();
          if (ghostIndex < getNAtoms()) {
            if (std::find(bendAtoms.begin(), bendAtoms.end(), ghostIndex) ==
                bendAtoms.end()) {
              oss << "Error in Fragment " << getName() << ": ghostVectorSouce "
                  << ghostIndex << "is invalid\n";
              throw OpenMDException(oss.str());
            }
            if (!getAtomStamp(ghostIndex)->haveOrientation()) {
              oss << "Error in Fragment " << getName()
                  << ": ghost atom must be a directional atom\n";
              throw OpenMDException(oss.str());
            }
          } else {
            oss << "Error in Fragment " << getName() << ": ghostVectorSource "
                << ghostIndex << "  is invalid\n";
            throw OpenMDException(oss.str());
          }
        }
      } else if (bendAtoms.size() == 3 && bendStamp->haveGhostVectorSource()) {
        oss << "Error in Fragment " << getName()
            << ": normal bend should not have ghostVectorSouce\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp       = getBendStamp(i);
      std::vector<int> bendAtoms = bendStamp->getMembers();
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = bendAtoms.begin(); j != bendAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 2) {
            oss << "Error in Fragment " << getName() << ": bend"
                << containerToString(bendAtoms)
                << "has three atoms on the same rigid body\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int>> allBends;
    std::set<std::tuple<int, int, int>>::iterator iter;
    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp  = getBendStamp(i);
      std::vector<int> bend = bendStamp->getMembers();
      if (bend.size() == 2) {
        // in case we have two ghost bend. For example,
        // bend {
        // members (0, 1);
        //   ghostVectorSource = 0;
        // }
        // and
        // bend {
        //   members (0, 1);
        // ghostVectorSource = 0;
        // }
        // In order to distinguish them. we expand them to Tuple3.
        // the first one is expanded to (0, 0, 1) while the second one
        // is expaned to (0, 1, 1)
        int ghostIndex = bendStamp->getGhostVectorSource();
        std::vector<int>::iterator j =
            std::find(bend.begin(), bend.end(), ghostIndex);
        if (j != bend.end()) { bend.insert(j, ghostIndex); }
      }

      std::tuple<int, int, int> bendTuple {bend[0], bend[1], bend[2]};
      auto& [first, second, third] = bendTuple;

      // make sure bendTuple.first is always less than or equal to
      // bendTuple.third
      if (first > third) { std::swap(first, third); }

      iter = allBends.find(bendTuple);
      if (iter != allBends.end()) {
        oss << "Error in Fragment " << getName() << ": "
            << "Bend" << containerToString(bend) << " appears multiple times\n";
        throw OpenMDException(oss.str());
      } else {
        allBends.insert(bendTuple);
      }
    }
  }